

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool c4::yml::anon_unknown_0::_is_scalar_next__rmap_val(csubstr s)

{
  byte bVar1;
  int iVar2;
  ulong in_RSI;
  byte *in_RDI;
  bool bVar3;
  basic_substring<const_char> local_10;
  
  if (in_RSI < 2) {
    if (in_RSI != 0) {
LAB_001e8dec:
      bVar1 = *in_RDI;
LAB_001e8dee:
      if ((bVar1 | 0x20) == 0x7b) goto LAB_001e8df9;
    }
    iVar2 = basic_substring<const_char>::compare(&local_10,"-",1);
    bVar3 = iVar2 != 0;
  }
  else {
    bVar1 = *in_RDI;
    if (bVar1 != 0x2d) goto LAB_001e8dee;
    if (in_RDI[1] != 0x20) goto LAB_001e8dec;
LAB_001e8df9:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool _is_scalar_next__rmap_val(csubstr s)
{
    return !(s.begins_with("- ") || s.begins_with_any("{[") || s == "-");
}